

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:220:23)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:220:23)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  ExceptionOr<kj::Maybe<unsigned_long>_> depResult;
  Maybe<unsigned_long> local_3c8;
  MessageReaderAndFds local_3b8;
  ExceptionOr<capnp::MessageReaderAndFds> local_398;
  ExceptionOrValue local_1d8;
  char local_40;
  char local_38;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_30;
  
  local_1d8.exception.ptr.isSet = false;
  local_40 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1d8);
  uVar1 = local_1d8.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_1d8.exception.ptr.isSet == true) {
    local_398.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1d8.exception.ptr.field_1.value.ownFile.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1d8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1d8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1d8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1d8.exception.ptr.field_1.value.file;
    local_398.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1d8.exception.ptr.field_1._32_8_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1d8.exception.ptr.field_1.value.description.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1d8.exception.ptr.field_1.value.description.content.size_;
    local_1d8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1d8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1d8.exception.ptr.field_1.value.description.content.disposer;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1d8.exception.ptr.field_1.value.context.ptr.disposer;
    local_1d8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar1;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1d8.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1d8.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1d8.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1d8.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1d8.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_398.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1d8.exception.ptr.field_1 + 0x68),0x105);
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1d8.exception.ptr.field_1.value.details.builder.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1d8.exception.ptr.field_1.value.details.builder.pos;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1d8.exception.ptr.field_1.value.details.builder.endPtr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1d8.exception.ptr.field_1.value.details.builder.disposer;
    local_1d8.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1d8.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1d8.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_398.value.ptr.isSet = false;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_398);
    uVar1 = local_398.value.ptr.field_1.value.reader.ptr;
    if ((local_398.value.ptr.isSet == true) &&
       (local_398.value.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_398.value.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_398.value.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_398.value.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                         (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  else {
    if (local_40 != '\x01') goto LAB_002fa146;
    local_3c8.ptr.isSet = (bool)local_38;
    if (local_38 == '\x01') {
      local_3c8.ptr.field_1 = local_30;
      local_38 = '\0';
    }
    anon_class_32_2_fe89d4e7_for_func::operator()(&local_3b8,&this->func,&local_3c8);
    local_398.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_398.value.ptr.isSet = true;
    local_398.value.ptr.field_1.value.reader.disposer = local_3b8.reader.disposer;
    local_398.value.ptr.field_1.value.reader.ptr = local_3b8.reader.ptr;
    local_3b8.reader.ptr = (MessageReader *)0x0;
    local_398.value.ptr.field_1.value.fds.ptr = local_3b8.fds.ptr;
    local_398.value.ptr.field_1.value.fds.size_ = local_3b8.fds.size_;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_398);
    uVar1 = local_398.value.ptr.field_1.value.reader.ptr;
    if ((local_398.value.ptr.isSet == true) &&
       (local_398.value.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_398.value.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_398.value.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_398.value.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                         (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  if (local_398.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_398.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_002fa146:
  if (local_1d8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }